

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_open_debugfile_by_buildid
              (backtrace_state *state,char *buildid_data,size_t buildid_size,
              backtrace_error_callback error_callback,void *data)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char local_88;
  int local_80;
  uchar nib;
  int iStack_7c;
  uchar b;
  int does_not_exist;
  int ret;
  size_t i;
  char *t;
  char *bd_filename;
  size_t len;
  size_t suffix_len;
  char *suffix;
  size_t prefix_len;
  char *prefix;
  void *data_local;
  backtrace_error_callback error_callback_local;
  size_t buildid_size_local;
  char *buildid_data_local;
  backtrace_state *state_local;
  
  prefix_len = (size_t)anon_var_dwarf_55ea1;
  suffix = (char *)0x19;
  suffix_len = (size_t)anon_var_dwarf_55eb8;
  len = 6;
  bd_filename = (char *)(buildid_size * 2 + 0x21);
  prefix = (char *)data;
  data_local = error_callback;
  error_callback_local = (backtrace_error_callback)buildid_size;
  buildid_size_local = (size_t)buildid_data;
  buildid_data_local = (char *)state;
  t = (char *)tcmalloc_backtrace_alloc(state,(size_t)bd_filename,error_callback,data);
  if (t == (char *)0x0) {
    state_local._4_4_ = -1;
  }
  else {
    builtin_strncpy(t,"/usr/lib/debug/.build-id/",0x19);
    i = (size_t)(t + 0x19);
    for (_does_not_exist = (backtrace_error_callback)0x0; _does_not_exist < error_callback_local;
        _does_not_exist = _does_not_exist + 1) {
      bVar3 = (byte)_does_not_exist[buildid_size_local];
      bVar2 = (byte)((int)(bVar3 & 0xf0) >> 4);
      if (bVar2 < 10) {
        local_88 = bVar2 + 0x30;
      }
      else {
        local_88 = bVar2 + 0x57;
      }
      *(char *)i = local_88;
      bVar3 = bVar3 & 0xf;
      if (bVar3 < 10) {
        cVar4 = bVar3 + 0x30;
      }
      else {
        cVar4 = bVar3 + 0x57;
      }
      *(char *)(i + 1) = cVar4;
      puVar1 = (undefined1 *)(i + 2);
      if (_does_not_exist == (backtrace_error_callback)0x0) {
        *(undefined1 *)(i + 2) = 0x2f;
        puVar1 = (undefined1 *)(i + 3);
      }
      i = (size_t)puVar1;
    }
    *(undefined4 *)i = 0x6265642e;
    *(undefined2 *)(i + 4) = 0x6775;
    *(undefined1 *)(i + 6) = 0;
    iStack_7c = tcmalloc_backtrace_open(t,(backtrace_error_callback)data_local,prefix,&local_80);
    tcmalloc_backtrace_free
              ((backtrace_state *)buildid_data_local,t,(size_t)bd_filename,
               (backtrace_error_callback)data_local,prefix);
    state_local._4_4_ = iStack_7c;
  }
  return state_local._4_4_;
}

Assistant:

static int
elf_open_debugfile_by_buildid (struct backtrace_state *state,
			       const char *buildid_data, size_t buildid_size,
			       backtrace_error_callback error_callback,
			       void *data)
{
  const char * const prefix = SYSTEM_BUILD_ID_DIR;
  const size_t prefix_len = strlen (prefix);
  const char * const suffix = ".debug";
  const size_t suffix_len = strlen (suffix);
  size_t len;
  char *bd_filename;
  char *t;
  size_t i;
  int ret;
  int does_not_exist;

  len = prefix_len + buildid_size * 2 + suffix_len + 2;
  bd_filename = backtrace_alloc (state, len, error_callback, data);
  if (bd_filename == NULL)
    return -1;

  t = bd_filename;
  memcpy (t, prefix, prefix_len);
  t += prefix_len;
  for (i = 0; i < buildid_size; i++)
    {
      unsigned char b;
      unsigned char nib;

      b = (unsigned char) buildid_data[i];
      nib = (b & 0xf0) >> 4;
      *t++ = nib < 10 ? '0' + nib : 'a' + nib - 10;
      nib = b & 0x0f;
      *t++ = nib < 10 ? '0' + nib : 'a' + nib - 10;
      if (i == 0)
	*t++ = '/';
    }
  memcpy (t, suffix, suffix_len);
  t[suffix_len] = '\0';

  ret = backtrace_open (bd_filename, error_callback, data, &does_not_exist);

  backtrace_free (state, bd_filename, len, error_callback, data);

  /* gdb checks that the debuginfo file has the same build ID note.
     That seems kind of pointless to me--why would it have the right
     name but not the right build ID?--so skipping the check.  */

  return ret;
}